

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TlsStrategy.cpp
# Opt level: O0

optional<Vault::AuthenticationResponse> * __thiscall
Vault::TlsStrategy::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,TlsStrategy *this,
          Client *client)

{
  Url local_40;
  Client *local_20;
  Client *client_local;
  TlsStrategy *this_local;
  
  local_20 = client;
  client_local = (Client *)this;
  this_local = (TlsStrategy *)__return_storage_ptr__;
  getUrl_abi_cxx11_(&local_40,(TlsStrategy *)client,client);
  HttpConsumer::authenticate(__return_storage_ptr__,client,&local_40,&this->cert_,&this->key_);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::TlsStrategy::authenticate(const Client &client) {
  return HttpConsumer::authenticate(client, getUrl(client), cert_, key_);
}